

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<float>::TPZFMatrix
          (TPZFMatrix<float> *this,int64_t rows,int64_t cols,float *buf,int64_t sz)

{
  float *pfVar1;
  ulong uVar2;
  
  TPZMatrix<float>::TPZMatrix(&this->super_TPZMatrix<float>,&PTR_PTR_01653b68,rows,cols);
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_016538b0;
  this->fElem = buf;
  this->fGiven = buf;
  this->fSize = sz;
  pfVar1 = (float *)0x0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016490a8;
  (this->fWork).fNAlloc = 0;
  (this->fWork).fStore = (float *)0x0;
  (this->fWork).fNElements = 0;
  uVar2 = cols * rows;
  if (uVar2 != 0) {
    if (uVar2 - sz == 0 || (long)uVar2 < sz) {
      return;
    }
    pfVar1 = (float *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
  }
  this->fElem = pfVar1;
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,TVar * buf,const int64_t sz)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),TPZMatrix<TVar>( rows, cols ), 
fElem(buf),fGiven(buf),fSize(sz) {
    int64_t size = rows * cols;
    if(size == 0)
    {
        fElem = NULL;
    }
    else if(size > sz)
    {
        fElem=new TVar[size];
#ifndef PZNODEBUG
        if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    }
}